

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_13fed1::BuildFileImpl::parseCommandsMapping(BuildFileImpl *this,MappingNode *map)

{
  pointer *pppCVar1;
  KeyValueNode *pKVar2;
  iterator __position;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef message;
  StringRef Key;
  StringRef Key_00;
  Command *pCVar3;
  _Alloc_hider _Var4;
  char cVar5;
  int iVar6;
  Node *pNVar7;
  MappingNode *pMVar8;
  BuildFileImpl *pBVar9;
  Tool *pTVar10;
  BuildFileImpl *C;
  long *plVar11;
  uint uVar12;
  Command *forNode;
  ScalarNode *scalar;
  char *pcVar13;
  ScalarNode *scalar_00;
  ScalarNode *extraout_RDX;
  ScalarNode *extraout_RDX_00;
  ScalarNode *extraout_RDX_01;
  ScalarNode *extraout_RDX_02;
  ScalarNode *scalar_02;
  ScalarNode *scalar_03;
  ScalarNode *extraout_RDX_03;
  ScalarNode *pSVar14;
  ScalarNode *extraout_RDX_04;
  SequenceNode *__range5;
  ulong uVar15;
  bool bVar16;
  StringRef message_00;
  StringRef message_01;
  StringRef name_03;
  StringRef name_04;
  StringRef message_02;
  StringRef name_05;
  StringRef message_03;
  StringRef name_06;
  StringRef message_04;
  StringRef message_05;
  StringRef message_06;
  StringRef message_07;
  StringRef message_08;
  StringRef message_09;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_bool>
  pVar17;
  iterator it;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  command;
  Node *node;
  iterator __begin5;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> nodes;
  string value;
  iterator __begin8;
  string name;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_148;
  Command *local_140;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [32];
  string local_d8;
  undefined1 local_b8 [40];
  StringMapImpl *local_90;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_88;
  string local_80;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  Command *local_38;
  ScalarNode *scalar_01;
  
  local_60.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(map);
  if (local_60.Base == (MappingNode *)0x0) {
    bVar16 = true;
  }
  else {
    forNode = (Command *)&this->commands;
    local_90 = (StringMapImpl *)forNode;
    do {
      pKVar2 = (local_60.Base)->CurrentEntry;
      if (pKVar2 == (KeyValueNode *)0x0) {
LAB_0013b21a:
        pcVar13 = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_0013b246:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                      ,0x151,pcVar13);
      }
      pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
      if (pNVar7->TypeID == 1) {
        pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar2);
        if (pNVar7->TypeID != 4) {
          pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar2);
          forNode = (Command *)0x24;
          pcVar13 = "invalid value type in \'commands\' map";
          goto LAB_0013a503;
        }
        pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  (&local_80,pNVar7,scalar);
        pMVar8 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar2);
        Key.Length = local_80._M_string_length;
        Key.Data = local_80._M_dataplus._M_p;
        iVar6 = llvm::StringMapImpl::FindKey(local_90,Key);
        if ((iVar6 == -1) ||
           (forNode = (Command *)(ulong)(this->commands).super_StringMapImpl.NumBuckets,
           (Command *)(long)iVar6 == forNode)) {
          local_148.Base = (MappingNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(pMVar8);
          local_138._0_8_ = (MappingNode *)0x0;
          bVar16 = llvm::yaml::
                   basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                   operator==(&local_148,
                              (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                               *)local_138);
          if (bVar16) {
            pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
            forNode = (Command *)0x2f;
            pcVar13 = "missing \'tool\' key for command in \'command\' map";
            goto LAB_0013a578;
          }
          if ((local_148.Base == (MappingNode *)0x0) ||
             ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
          pBVar9 = (BuildFileImpl *)llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry)
          ;
          name_03.Length = (size_t)forNode;
          name_03.Data = (char *)0x4;
          bVar16 = nodeIsScalarString(pBVar9,(Node *)0x1c49de,name_03);
          if (bVar16) {
            if ((local_148.Base == (MappingNode *)0x0) ||
               ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
            pNVar7 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
            if (pNVar7->TypeID == 1) {
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) {
LAB_0013b250:
                __assert_fail("Base && Base->CurrentEntry && \"Attempted to access end iterator!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                              ,0x14b,
                              "ValueT *llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator->() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
                             );
              }
              pNVar7 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        ((string *)local_138,pNVar7,scalar_00);
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
              name_00.Length = local_138._8_8_;
              name_00.Data = (char *)local_138._0_8_;
              forNode = (Command *)
                        llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              pTVar10 = getOrCreateTool(this,name_00,(Node *)forNode);
              if ((MappingNode *)local_138._0_8_ != (MappingNode *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              if (pTVar10 == (Tool *)0x0) {
                iVar6 = 1;
              }
              else {
                forNode = (Command *)local_80._M_string_length;
                (*pTVar10->_vptr_Tool[5])(&local_140,pTVar10,local_80._M_dataplus._M_p);
                if (local_140 == (Command *)0x0) {
                  if ((local_148.Base == (MappingNode *)0x0) ||
                     ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
                  pNVar7 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
                  message_09.Length = 0x1f;
                  message_09.Data = "tool failed to create a command";
                  forNode = (Command *)0x1f;
                  error(this,pNVar7,message_09);
                  iVar6 = 1;
                }
                else {
                  do {
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&local_148);
                    if (local_148.Base == (MappingNode *)0x0) {
                      (*this->delegate->_vptr_BuildFileDelegate[0xb])
                                (this->delegate,local_80._M_dataplus._M_p,local_80._M_string_length,
                                 local_140);
                      Key_00.Length = local_80._M_string_length;
                      Key_00.Data = local_80._M_dataplus._M_p;
                      pVar17 = llvm::
                               StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                               ::try_emplace<>((StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                                                *)local_90,Key_00);
                      forNode = local_140;
                      local_140 = (Command *)0x0;
                      plVar11 = *(long **)(*(long *)pVar17.first.
                                                                                                        
                                                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                                  .Ptr.
                                                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                          + 8);
                      *(Command **)
                       (*(long *)pVar17.first.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                                 .Ptr.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                       + 8) = forNode;
                      iVar6 = 0;
                      if (plVar11 != (long *)0x0) {
                        (**(code **)(*plVar11 + 8))();
                        iVar6 = 0;
                      }
                      break;
                    }
                    if ((((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0) ||
                        (pBVar9 = (BuildFileImpl *)
                                  llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry),
                        local_148.Base == (MappingNode *)0x0)) ||
                       ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
                    C = (BuildFileImpl *)
                        llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
                    name_04.Length = (size_t)forNode;
                    name_04.Data = (char *)0x6;
                    bVar16 = nodeIsScalarString(pBVar9,(Node *)0x1ccb06,name_04);
                    if (bVar16) {
                      if (*(int *)&C->delegate != 5) {
                        forNode = (Command *)0x2b;
                        pcVar13 = "invalid value type for \'inputs\' command key";
                        pBVar9 = C;
                        goto LAB_0013ae1c;
                      }
                      local_d8._M_dataplus._M_p = (pointer)0x0;
                      local_d8._M_string_length = 0;
                      local_d8.field_2._M_allocated_capacity = 0;
                      local_f8._0_8_ =
                           llvm::yaml::begin<llvm::yaml::SequenceNode>((SequenceNode *)C);
                      pSVar14 = extraout_RDX;
                      while ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                        pNVar7 = *(Node **)(local_f8._0_8_ + 0x50);
                        if (pNVar7 == (Node *)0x0) goto LAB_0013b231;
                        if (pNVar7->TypeID == 1) {
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_138,pNVar7,pSVar14);
                          name_01.Length = local_138._8_8_;
                          name_01.Data = (char *)local_138._0_8_;
                          local_b8._0_8_ = getOrCreateNode(this,name_01,true);
                          if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
                            std::
                            vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                            ::_M_realloc_insert<llbuild::buildsystem::Node*>
                                      ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                        *)&local_d8,(iterator)local_d8._M_string_length,
                                       (Node **)local_b8);
                          }
                          else {
                            *(undefined8 *)local_d8._M_string_length = local_b8._0_8_;
                            local_d8._M_string_length = local_d8._M_string_length + 8;
                          }
                          if ((MappingNode *)local_138._0_8_ != (MappingNode *)(local_138 + 0x10)) {
                            operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                          }
                        }
                        else {
                          message_02.Length = 0x29;
                          message_02.Data = "invalid node type in \'inputs\' command key";
                          error(this,pNVar7,message_02);
                        }
                        llvm::yaml::
                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                        operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    *)local_f8);
                        pSVar14 = extraout_RDX_00;
                      }
                      local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                      uVar12 = *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                               (int)local_138._24_8_;
                      forNode = (Command *)(ulong)uVar12;
                      local_138._0_8_ = this->delegate;
                      local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                      local_138._16_8_ = (this->mainFilename)._M_string_length;
                      local_118._M_p._0_4_ = uVar12;
                      (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[8])
                                (local_140,local_138,&local_d8);
LAB_0013add8:
                      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
                        uVar15 = local_d8.field_2._M_allocated_capacity -
                                 (long)local_d8._M_dataplus._M_p;
LAB_0013aded:
                        operator_delete(local_d8._M_dataplus._M_p,uVar15);
                      }
LAB_0013adf2:
                      iVar6 = 0;
                    }
                    else {
                      name_05.Length = (size_t)forNode;
                      name_05.Data = (char *)0x7;
                      bVar16 = nodeIsScalarString(pBVar9,(Node *)0x1ccb1c,name_05);
                      if (bVar16) {
                        if (*(int *)&C->delegate != 5) {
                          forNode = (Command *)0x2c;
                          pcVar13 = "invalid value type for \'outputs\' command key";
                          pBVar9 = C;
                          goto LAB_0013ae1c;
                        }
                        local_d8._M_dataplus._M_p = (pointer)0x0;
                        local_d8._M_string_length = 0;
                        local_d8.field_2._M_allocated_capacity = 0;
                        local_f8._0_8_ =
                             llvm::yaml::begin<llvm::yaml::SequenceNode>((SequenceNode *)C);
                        pSVar14 = extraout_RDX_01;
                        while ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                          pNVar7 = *(Node **)(local_f8._0_8_ + 0x50);
                          if (pNVar7 == (Node *)0x0) goto LAB_0013b231;
                          if (pNVar7->TypeID == 1) {
                            (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                      ((string *)local_138,pNVar7,pSVar14);
                            name_02.Length = local_138._8_8_;
                            name_02.Data = (char *)local_138._0_8_;
                            pMVar8 = (MappingNode *)getOrCreateNode(this,name_02,true);
                            if ((MappingNode *)local_138._0_8_ != (MappingNode *)(local_138 + 0x10))
                            {
                              operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1))
                              ;
                            }
                            local_138._0_8_ = pMVar8;
                            if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity)
                            {
                              std::
                              vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                              ::_M_realloc_insert<llbuild::buildsystem::Node*const&>
                                        ((vector<llbuild::buildsystem::Node*,std::allocator<llbuild::buildsystem::Node*>>
                                          *)&local_d8,(iterator)local_d8._M_string_length,
                                         (Node **)local_138);
                            }
                            else {
                              *(MappingNode **)local_d8._M_string_length = pMVar8;
                              local_d8._M_string_length = local_d8._M_string_length + 8;
                            }
                            local_b8._0_8_ = local_140;
                            __position._M_current =
                                 (((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                                    *)&((Node *)local_138._0_8_)->Anchor)->
                                 super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                            if (__position._M_current ==
                                (Command **)(((Node *)local_138._0_8_)->Tag).Data) {
                              std::
                              vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                              ::_M_realloc_insert<llbuild::buildsystem::Command*>
                                        ((vector<llbuild::buildsystem::Command*,std::allocator<llbuild::buildsystem::Command*>>
                                          *)&((Node *)local_138._0_8_)->Anchor,__position,
                                         (Command **)local_b8);
                            }
                            else {
                              *__position._M_current = local_140;
                              pppCVar1 = &(((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                                             *)&((Node *)local_138._0_8_)->Anchor)->
                                          super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish;
                              *pppCVar1 = *pppCVar1 + 1;
                            }
                          }
                          else {
                            message_03.Length = 0x2a;
                            message_03.Data = "invalid node type in \'outputs\' command key";
                            error(this,pNVar7,message_03);
                          }
                          llvm::yaml::
                          basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                          operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                      *)local_f8);
                          pSVar14 = extraout_RDX_02;
                        }
                        local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                        uVar12 = *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                                 (int)local_138._24_8_;
                        forNode = (Command *)(ulong)uVar12;
                        local_138._0_8_ = this->delegate;
                        local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                        local_138._16_8_ = (this->mainFilename)._M_string_length;
                        local_118._M_p._0_4_ = uVar12;
                        (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[9])
                                  (local_140,local_138,&local_d8);
                        goto LAB_0013add8;
                      }
                      name_06.Length = (size_t)forNode;
                      name_06.Data = (char *)0xb;
                      bVar16 = nodeIsScalarString(pBVar9,(Node *)0x1cb560,name_06);
                      pCVar3 = local_140;
                      if (!bVar16) {
                        if (*(int *)&pBVar9->delegate != 1) {
                          forNode = (Command *)0x22;
                          pcVar13 = "invalid key type in \'commands\' map";
                          goto LAB_0013ae1c;
                        }
                        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                  (&local_d8,pBVar9,scalar_01);
                        _Var4._M_p = local_d8._M_dataplus._M_p;
                        pCVar3 = local_140;
                        iVar6 = *(int *)&C->delegate;
                        if (iVar6 == 1) {
                          local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                          local_138._0_8_ = this->delegate;
                          local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                          local_138._16_8_ = (this->mainFilename)._M_string_length;
                          local_118._M_p._0_4_ =
                               *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                               (int)local_138._24_8_;
                          local_38 = (Command *)local_d8._M_string_length;
                          (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                    ((string *)local_f8,C,(ScalarNode *)local_138._16_8_);
                          forNode = local_38;
                          iVar6 = (*(pCVar3->super_JobDescriptor)._vptr_JobDescriptor[10])
                                            (pCVar3,local_138,_Var4._M_p,local_38,local_f8._0_8_,
                                             local_f8._8_8_);
                          cVar5 = (char)iVar6;
                          if ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)(local_f8 + 0x10)) {
                            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                          }
LAB_0013b057:
                          if (cVar5 == '\0') {
                            iVar6 = 1;
                            goto LAB_0013b070;
                          }
                          iVar6 = 0;
                          bVar16 = true;
                        }
                        else {
                          if (iVar6 == 5) {
                            local_f8._0_8_ = (SequenceNode *)0x0;
                            local_f8._8_8_ = (pointer)0x0;
                            local_f8._16_8_ = 0;
                            local_b8._0_8_ =
                                 llvm::yaml::begin<llvm::yaml::SequenceNode>((SequenceNode *)C);
                            pSVar14 = extraout_RDX_03;
                            while (forNode = (Command *)local_d8._M_string_length,
                                  _Var4._M_p = local_d8._M_dataplus._M_p, pCVar3 = local_140,
                                  (Command *)local_b8._0_8_ != (Command *)0x0) {
                              pNVar7 = *(Node **)(local_b8._0_8_ + 0x50);
                              if (pNVar7 == (Node *)0x0) goto LAB_0013b231;
                              if (pNVar7->TypeID == 1) {
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_((string *)local_138,pNVar7,pSVar14);
                                std::
                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                emplace_back<std::__cxx11::string>
                                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                            *)local_f8,(string *)local_138);
                                if ((MappingNode *)local_138._0_8_ !=
                                    (MappingNode *)(local_138 + 0x10)) {
                                  operator_delete((void *)local_138._0_8_,
                                                  (ulong)(local_138._16_8_ + 1));
                                }
                              }
                              else {
                                message_05.Length = 0x30;
                                message_05.Data =
                                     "invalid value type for command in \'commands\' map";
                                error(this,pNVar7,message_05);
                              }
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator++((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                            *)local_b8);
                              pSVar14 = extraout_RDX_04;
                            }
                            local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                            local_138._0_8_ = this->delegate;
                            local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                            local_138._16_8_ = (this->mainFilename)._M_string_length;
                            local_118._M_p._0_4_ =
                                 *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                                 (int)local_138._24_8_;
                            local_b8._0_8_ = (Command *)0x0;
                            local_b8._8_8_ = 0;
                            local_b8._16_8_ = 0;
                            std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                      ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)
                                       local_b8,local_f8._0_8_,local_f8._8_8_);
                            iVar6 = (*(pCVar3->super_JobDescriptor)._vptr_JobDescriptor[0xb])
                                              (pCVar3,local_138,_Var4._M_p,forNode,local_b8._0_8_,
                                               (long)(local_b8._8_8_ - local_b8._0_8_) >> 4);
                            cVar5 = (char)iVar6;
                            if ((Command *)local_b8._0_8_ != (Command *)0x0) {
                              operator_delete((void *)local_b8._0_8_,
                                              local_b8._16_8_ - local_b8._0_8_);
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_f8);
                            goto LAB_0013b057;
                          }
                          if (iVar6 == 4) {
                            local_58.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_58.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_58.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_88.Base =
                                 (MappingNode *)
                                 llvm::yaml::begin<llvm::yaml::MappingNode>((MappingNode *)C);
                            pCVar3 = local_140;
                            _Var4._M_p = local_d8._M_dataplus._M_p;
                            forNode = (Command *)local_d8._M_string_length;
                            while (local_140 = pCVar3, local_d8._M_dataplus._M_p = _Var4._M_p,
                                  local_d8._M_string_length = (size_type)forNode,
                                  local_88.Base != (MappingNode *)0x0) {
                              pKVar2 = (local_88.Base)->CurrentEntry;
                              if (pKVar2 == (KeyValueNode *)0x0) goto LAB_0013b21a;
                              pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                              if (pNVar7->TypeID == 1) {
                                pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar2);
                                if (pNVar7->TypeID != 1) {
                                  pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                                  pcVar13 = "invalid value type for \'";
                                  goto LAB_0013ac1b;
                                }
                                pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_((string *)local_f8,pNVar7,scalar_02)
                                ;
                                pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar2);
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_((string *)local_b8,pNVar7,scalar_03)
                                ;
                                local_138._0_8_ = local_138 + 0x10;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)local_138,local_f8._0_8_,
                                           (long)&((_Alloc_hider *)local_f8._8_8_)->_M_p +
                                           local_f8._0_8_);
                                local_118._M_p = (pointer)&local_108;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_118,local_b8._0_8_,
                                           (long)&((Node *)local_b8._0_8_)->_vptr_Node +
                                           local_b8._8_8_);
                                std::
                                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                            *)&local_58,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)local_138);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_118._M_p != &local_108) {
                                  operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1
                                                 );
                                }
                                if ((MappingNode *)local_138._0_8_ !=
                                    (MappingNode *)(local_138 + 0x10)) {
                                  operator_delete((void *)local_138._0_8_,
                                                  (ulong)(local_138._16_8_ + 1));
                                }
                                if ((Command *)local_b8._0_8_ != (Command *)(local_b8 + 0x10)) {
                                  operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                                }
                              }
                              else {
                                pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
                                pcVar13 = "invalid key type for \'";
LAB_0013ac1b:
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_f8,pcVar13,&local_d8);
                                plVar11 = (long *)std::__cxx11::string::append(local_f8);
                                pMVar8 = (MappingNode *)(plVar11 + 2);
                                if ((MappingNode *)*plVar11 == pMVar8) {
                                  local_138._16_8_ = (pMVar8->super_Node)._vptr_Node;
                                  local_138._24_8_ = plVar11[3];
                                  local_138._0_8_ = (MappingNode *)(local_138 + 0x10);
                                }
                                else {
                                  local_138._16_8_ = (pMVar8->super_Node)._vptr_Node;
                                  local_138._0_8_ = (MappingNode *)*plVar11;
                                }
                                local_138._8_8_ = plVar11[1];
                                *plVar11 = (long)pMVar8;
                                plVar11[1] = 0;
                                *(undefined1 *)(plVar11 + 2) = 0;
                                message.Length = local_138._8_8_;
                                message.Data = (char *)local_138._0_8_;
                                error(this,pNVar7,message);
                                if ((MappingNode *)local_138._0_8_ !=
                                    (MappingNode *)(local_138 + 0x10)) {
                                  operator_delete((void *)local_138._0_8_,
                                                  (ulong)(local_138._16_8_ + 1));
                                }
                              }
                              if ((SequenceNode *)local_f8._0_8_ !=
                                  (SequenceNode *)(local_f8 + 0x10)) {
                                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                              }
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator++(&local_88);
                              pCVar3 = local_140;
                              _Var4._M_p = local_d8._M_dataplus._M_p;
                              forNode = (Command *)local_d8._M_string_length;
                            }
                            local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                            local_138._0_8_ = this->delegate;
                            local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                            local_138._16_8_ = (this->mainFilename)._M_string_length;
                            local_118._M_p._4_4_ = (undefined4)((ulong)local_118._M_p >> 0x20);
                            local_118._M_p._0_4_ =
                                 *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                                 (int)local_138._24_8_;
                            local_f8._0_8_ = (SequenceNode *)0x0;
                            local_f8._8_8_ = (pointer)0x0;
                            local_f8._16_8_ = 0;
                            std::
                            vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                            ::
                            _M_range_initialize<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
                                      ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                        *)local_f8,
                                       local_58.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       local_58.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                            iVar6 = (*(pCVar3->super_JobDescriptor)._vptr_JobDescriptor[0xc])
                                              (pCVar3,local_138,_Var4._M_p,forNode,local_f8._0_8_,
                                               (long)(local_f8._8_8_ - local_f8._0_8_) >> 5);
                            cVar5 = (char)iVar6;
                            if ((SequenceNode *)local_f8._0_8_ != (SequenceNode *)0x0) {
                              operator_delete((void *)local_f8._0_8_,
                                              local_f8._16_8_ - local_f8._0_8_);
                            }
                            std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~vector(&local_58);
                            goto LAB_0013b057;
                          }
                          message_06.Length = 0x30;
                          message_06.Data = "invalid value type for command in \'commands\' map";
                          forNode = (Command *)0x30;
                          error(this,(Node *)C,message_06);
                          iVar6 = 10;
LAB_0013b070:
                          bVar16 = false;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                          operator_delete(local_d8._M_dataplus._M_p,
                                          local_d8.field_2._M_allocated_capacity + 1);
                        }
                        if (!bVar16) goto LAB_0013ae26;
                        goto LAB_0013adf2;
                      }
                      if (*(int *)&C->delegate == 1) {
                        local_138._24_8_ = (pBVar9->mainFilename).field_2._M_allocated_capacity;
                        local_138._0_8_ = this->delegate;
                        local_138._8_8_ = (this->mainFilename)._M_dataplus._M_p;
                        local_138._16_8_ = (this->mainFilename)._M_string_length;
                        local_118._M_p._0_4_ =
                             *(int *)((long)&(pBVar9->mainFilename).field_2 + 8) -
                             (int)local_138._24_8_;
                        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                  (&local_d8,C,(ScalarNode *)local_138._16_8_);
                        forNode = (Command *)local_d8._M_string_length;
                        (*(pCVar3->super_JobDescriptor)._vptr_JobDescriptor[7])
                                  (pCVar3,local_138,local_d8._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0013adf2;
                        uVar15 = local_d8.field_2._M_allocated_capacity + 1;
                        goto LAB_0013aded;
                      }
                      forNode = (Command *)0x30;
                      pcVar13 = "invalid value type for \'description\' command key";
                      pBVar9 = C;
LAB_0013ae1c:
                      message_04.Length = (size_t)forNode;
                      message_04.Data = pcVar13;
                      error(this,(Node *)pBVar9,message_04);
                      iVar6 = 10;
                    }
LAB_0013ae26:
                  } while ((iVar6 == 10) || (iVar6 == 0));
                }
                if (local_140 != (Command *)0x0) {
                  (*(local_140->super_JobDescriptor)._vptr_JobDescriptor[1])();
                }
              }
            }
            else {
              if ((local_148.Base == (MappingNode *)0x0) ||
                 ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
              pNVar7 = llvm::yaml::KeyValueNode::getValue((local_148.Base)->CurrentEntry);
              message_08.Length = 0x37;
              message_08.Data = "invalid \'tool\' value type for command in \'commands\' map";
              forNode = (Command *)0x37;
              error(this,pNVar7,message_08);
              iVar6 = 3;
              while (local_148.Base != (MappingNode *)0x0) {
                llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator++(&local_148);
              }
            }
          }
          else {
            if ((local_148.Base == (MappingNode *)0x0) ||
               ((local_148.Base)->CurrentEntry == (KeyValueNode *)0x0)) goto LAB_0013b250;
            pNVar7 = llvm::yaml::KeyValueNode::getKey((local_148.Base)->CurrentEntry);
            message_07.Length = 0x39;
            message_07.Data = "expected \'tool\' initial key for command in \'commands\' map";
            forNode = (Command *)0x39;
            error(this,pNVar7,message_07);
            iVar6 = 3;
            while (local_148.Base != (MappingNode *)0x0) {
              llvm::yaml::
              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
              operator++(&local_148);
            }
          }
        }
        else {
          pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
          forNode = (Command *)0x23;
          pcVar13 = "duplicate command in \'commands\' map";
LAB_0013a578:
          message_01.Length = (size_t)forNode;
          message_01.Data = pcVar13;
          error(this,pNVar7,message_01);
          iVar6 = 3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar2);
        forNode = (Command *)0x22;
        pcVar13 = "invalid key type in \'commands\' map";
LAB_0013a503:
        message_00.Length = (size_t)forNode;
        message_00.Data = pcVar13;
        error(this,pNVar7,message_00);
        iVar6 = 3;
      }
      if ((iVar6 != 3) && (iVar6 != 0)) goto LAB_0013b1fe;
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++(&local_60);
    } while (local_60.Base != (MappingNode *)0x0);
    iVar6 = 2;
LAB_0013b1fe:
    bVar16 = iVar6 == 2;
  }
  return bVar16;
LAB_0013b231:
  pcVar13 = 
  "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
  ;
  goto LAB_0013b246;
}

Assistant:

bool parseCommandsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'commands' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'commands' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Check that the command is not a duplicate.
      if (commands.count(name) != 0) {
        error(entry.getKey(), "duplicate command in 'commands' map");
        continue;
      }
      
      // Get the initial attribute, which must be the tool name.
      auto it = attrs->begin();
      if (it == attrs->end()) {
        error(entry.getKey(),
              "missing 'tool' key for command in 'command' map");
        continue;
      }
      if (!nodeIsScalarString(it->getKey(), "tool")) {
        error(it->getKey(),
              "expected 'tool' initial key for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(it->getValue(),
              "invalid 'tool' value type for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      
      // Lookup the tool for this command.
      auto tool = getOrCreateTool(
          stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(
                  it->getValue())),
          it->getValue());
      if (!tool) {
        return false;
      }
        
      // Create the command.
      auto command = tool->createCommand(name);
      if (!command) {
        error(it->getValue(), "tool failed to create a command");
        return false;
      }

      // Parse the remaining command attributes.
      ++it;
      for (; it != attrs->end(); ++it) {
        auto key = it->getKey();
        auto value = it->getValue();
        
        // If this is a known key, parse it.
        if (nodeIsScalarString(key, "inputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'inputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'inputs' command key");
              continue;
            }

            nodes.push_back(
                getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true));
          }

          command->configureInputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "outputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'outputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'outputs' command key");
              continue;
            }

            auto node = getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true);
            nodes.push_back(node);

            // Add this command to the node producer list.
            node->getProducers().push_back(command.get());
          }

          command->configureOutputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "description")) {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for 'description' command key");
            continue;
          }

          command->configureDescription(
              getContext(key), stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(value)));
        } else {
          // Otherwise, it should be an attribute assignment.
          
          // All keys must be scalar.
          if (key->getType() != llvm::yaml::Node::NK_Scalar) {
            error(key, "invalid key type in 'commands' map");
            continue;
          }

          auto attribute = stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(key));

          if (value->getType() == llvm::yaml::Node::NK_Mapping) {
            std::vector<std::pair<std::string, std::string>> values;
            for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
              // Every key must be scalar.
              if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid key type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }
              // Every value must be scalar.
              if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid value type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }

              std::string key = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
              std::string value = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
              values.push_back(std::make_pair(key, value));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<std::pair<StringRef, StringRef>>(
                        values.begin(), values.end()))) {
              return false;
            }
          } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
            std::vector<std::string> values;
            for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
              if (node.getType() != llvm::yaml::Node::NK_Scalar) {
                error(&node, "invalid value type for command in 'commands' map");
                continue;
              }
              values.push_back(
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(&node)));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<StringRef>(values.begin(), values.end()))) {
              return false;
            }
          } else {
            if (value->getType() != llvm::yaml::Node::NK_Scalar) {
              error(value, "invalid value type for command in 'commands' map");
              continue;
            }
            
            if (!command->configureAttribute(
                    getContext(key), attribute,
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(value)))) {
              return false;
            }
          }
        }
      }

      // Let the delegate know we loaded a command.
      delegate.loadedCommand(name, *command);

      // Add the command to the commands map.
      commands[name] = std::move(command);
    }

    return true;
  }